

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::IsLowerTriangular(Matrix *this)

{
  bool bVar1;
  const_reference this_00;
  const_reference a;
  Fraction local_28;
  int local_20;
  int local_1c;
  int column;
  int row;
  Matrix *this_local;
  
  local_1c = 0;
  _column = this;
  do {
    local_20 = local_1c;
    if (this->n_ <= local_1c) {
      return true;
    }
    while (local_20 = local_20 + 1, local_20 < this->m_) {
      this_00 = std::
                vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                ::operator[](&this->elements_,(long)local_1c);
      a = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](this_00,(long)local_20);
      Fraction::Fraction(&local_28,0);
      bVar1 = operator!=(a,&local_28);
      if (bVar1) {
        return false;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool Matrix::IsLowerTriangular() const {
  for (int row = 0; row < n_; ++row) {
    for (int column = row + 1; column < m_; ++column) {
      if (elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}